

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void template_conform(t_template *tfrom,t_template *tto)

{
  int iVar1;
  int iVar2;
  t_dataslot *ptVar3;
  bool bVar4;
  int iVar5;
  int *conformaction_00;
  void *fatso;
  _glist *local_60;
  _glist *gl;
  t_dataslot *dataslot_1;
  t_dataslot *dataslot2;
  t_dataslot *dataslot;
  int doit;
  int *conformedfrom;
  int *conformaction;
  int j;
  int i;
  int nfrom;
  int nto;
  t_template *tto_local;
  t_template *tfrom_local;
  
  iVar1 = tto->t_n;
  iVar2 = tfrom->t_n;
  conformaction_00 = (int *)getbytes((long)iVar1 << 2);
  fatso = getbytes((long)iVar2 << 2);
  bVar4 = false;
  for (conformaction._4_4_ = 0; conformaction._4_4_ < iVar1;
      conformaction._4_4_ = conformaction._4_4_ + 1) {
    conformaction_00[conformaction._4_4_] = -1;
  }
  for (conformaction._4_4_ = 0; conformaction._4_4_ < iVar2;
      conformaction._4_4_ = conformaction._4_4_ + 1) {
    *(undefined4 *)((long)fatso + (long)conformaction._4_4_ * 4) = 0;
  }
  for (conformaction._4_4_ = 0; conformaction._4_4_ < iVar1;
      conformaction._4_4_ = conformaction._4_4_ + 1) {
    ptVar3 = tto->t_vec;
    for (conformaction._0_4_ = 0; (int)conformaction < iVar2;
        conformaction._0_4_ = (int)conformaction + 1) {
      iVar5 = dataslot_matches(ptVar3 + conformaction._4_4_,tfrom->t_vec + (int)conformaction,1);
      if (iVar5 != 0) {
        conformaction_00[conformaction._4_4_] = (int)conformaction;
        *(undefined4 *)((long)fatso + (long)(int)conformaction * 4) = 1;
      }
    }
  }
  for (conformaction._4_4_ = 0; conformaction._4_4_ < iVar1;
      conformaction._4_4_ = conformaction._4_4_ + 1) {
    if (conformaction_00[conformaction._4_4_] < 0) {
      ptVar3 = tto->t_vec;
      for (conformaction._0_4_ = 0; (int)conformaction < iVar2;
          conformaction._0_4_ = (int)conformaction + 1) {
        if ((*(int *)((long)fatso + (long)(int)conformaction * 4) == 0) &&
           (iVar5 = dataslot_matches(ptVar3 + conformaction._4_4_,tfrom->t_vec + (int)conformaction,
                                     0), iVar5 != 0)) {
          conformaction_00[conformaction._4_4_] = (int)conformaction;
          *(undefined4 *)((long)fatso + (long)(int)conformaction * 4) = 1;
        }
      }
    }
  }
  if (iVar1 == iVar2) {
    for (conformaction._4_4_ = 0; conformaction._4_4_ < iVar1;
        conformaction._4_4_ = conformaction._4_4_ + 1) {
      if (conformaction_00[conformaction._4_4_] != conformaction._4_4_) {
        bVar4 = true;
      }
    }
  }
  else {
    bVar4 = true;
  }
  if (bVar4) {
    for (local_60 = pd_getcanvaslist(); local_60 != (_glist *)0x0; local_60 = local_60->gl_next) {
      template_conformglist(tfrom,tto,local_60,conformaction_00);
    }
  }
  freebytes(conformaction_00,(long)iVar1 << 2);
  freebytes(fatso,(long)iVar2 << 2);
  return;
}

Assistant:

void template_conform(t_template *tfrom, t_template *tto)
{
    int nto = tto->t_n, nfrom = tfrom->t_n, i, j,
        *conformaction = (int *)getbytes(sizeof(int) * nto),
        *conformedfrom = (int *)getbytes(sizeof(int) * nfrom), doit = 0;
    for (i = 0; i < nto; i++)
        conformaction[i] = -1;
    for (i = 0; i < nfrom; i++)
        conformedfrom[i] = 0;
    for (i = 0; i < nto; i++)
    {
        t_dataslot *dataslot = &tto->t_vec[i];
        for (j = 0; j < nfrom; j++)
        {
            t_dataslot *dataslot2 = &tfrom->t_vec[j];
            if (dataslot_matches(dataslot, dataslot2, 1))
            {
                conformaction[i] = j;
                conformedfrom[j] = 1;
            }
        }
    }
    for (i = 0; i < nto; i++)
        if (conformaction[i] < 0)
    {
        t_dataslot *dataslot = &tto->t_vec[i];
        for (j = 0; j < nfrom; j++)
            if (!conformedfrom[j] &&
                dataslot_matches(dataslot, &tfrom->t_vec[j], 0))
        {
            conformaction[i] = j;
            conformedfrom[j] = 1;
        }
    }
    if (nto != nfrom)
        doit = 1;
    else for (i = 0; i < nto; i++)
        if (conformaction[i] != i)
            doit = 1;

    if (doit)
    {
        t_glist *gl;
        for (gl = pd_getcanvaslist(); gl; gl = gl->gl_next)
            template_conformglist(tfrom, tto, gl, conformaction);
    }
    freebytes(conformaction, sizeof(int) * nto);
    freebytes(conformedfrom, sizeof(int) * nfrom);
}